

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

vector<Player_*,_std::allocator<Player_*>_> *
initPlayers(int numPlayers,Map *map,vector<char,_std::allocator<char>_> *playerRoles)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  __first;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  __last;
  pointer ppCVar2;
  vector<Map::Country*,std::allocator<Map::Country*>> *this;
  iterator __position;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position_00;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> __first_00;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> __last_00;
  uint uVar5;
  vector<Player*,std::allocator<Player*>> *this_00;
  Player *pPVar6;
  Hand *this_01;
  DiceRoller *this_02;
  ostream *poVar7;
  StatsObserver *this_03;
  PhaseObserver *this_04;
  size_t __i;
  long lVar8;
  pointer ppCVar9;
  int iVar10;
  Strategies strat;
  ulong uVar11;
  size_type __n;
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  countriesPerPlayer;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *countries;
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  local_2768;
  ulong local_2750;
  vector<char,_std::allocator<char>_> *local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  local_2768.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2768.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2768.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (size_type)numPlayers;
  local_2748 = playerRoles;
  std::
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::reserve(&local_2768,__n);
  if (0 < numPlayers) {
    iVar10 = numPlayers;
    do {
      local_2740._M_x[0] = (unsigned_long)operator_new(0x18);
      (((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_2740._M_x[0])->
      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_2740._M_x[0])->
      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_2740._M_x[0])->
      super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve
                ((vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)local_2740._M_x[0],
                 (long)(map->pMapCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(map->pMapCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::
      vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
      ::emplace_back<std::vector<Map::Country*,std::allocator<Map::Country*>>*&>
                ((vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
                  *)&local_2768,
                 (vector<Map::Country_*,_std::allocator<Map::Country_*>_> **)&local_2740);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  pvVar1 = map->pMapCountries;
  __first._M_current =
       (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar5 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar5;
  lVar8 = 1;
  pPVar6 = (Player *)local_2740._M_x[0];
  do {
    pPVar6 = (Player *)
             (ulong)(((uint)((ulong)pPVar6 >> 0x1e) ^ (uint)pPVar6) * 0x6c078965 + (int)lVar8);
    local_2740._M_x[lVar8] = (unsigned_long)pPVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2740._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<Map::Country**,std::vector<Map::Country*,std::allocator<Map::Country*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,__last,&local_2740);
  std::random_device::_M_fini();
  ppCVar9 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar9 !=
      (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)ppCVar9 - (long)ppCVar2 >> 3) <= uVar11) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      local_2740._M_x[0] = (unsigned_long)ppCVar2[uVar11];
      *(int *)&((Player *)local_2740._M_x[0])->strategy->_vptr_PlayerStrategy =
           (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                (long)numPlayers);
      this = (vector<Map::Country*,std::allocator<Map::Country*>> *)
             local_2768.
             super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11 % __n];
      __position._M_current = *(Country ***)(this + 8);
      if (__position._M_current == *(Country ***)(this + 0x10)) {
        std::vector<Map::Country*,std::allocator<Map::Country*>>::
        _M_realloc_insert<Map::Country*const&>(this,__position,(Country **)&local_2740);
      }
      else {
        *__position._M_current = (Country *)local_2740._M_x[0];
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      uVar11 = uVar11 + 1;
      ppCVar9 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppCVar9 -
                              (long)(pvVar1->
                                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_00 = (vector<Player*,std::allocator<Player*>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  std::vector<Player_*,_std::allocator<Player_*>_>::reserve
            ((vector<Player_*,_std::allocator<Player_*>_> *)this_00,__n);
  if (0 < numPlayers) {
    local_2750 = (ulong)(uint)numPlayers;
    uVar11 = 0;
    do {
      pPVar6 = (Player *)operator_new(0x38);
      pvVar1 = local_2768.
               super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11];
      this_01 = (Hand *)operator_new(8);
      Hand::Hand(this_01);
      this_02 = (DiceRoller *)operator_new(0x10);
      DiceRoller::DiceRoller(this_02);
      Player::Player(pPVar6,pvVar1,this_01,this_02,(int)uVar11);
      local_13b8._M_mt._M_x[0]._0_1_ = '\0';
      pcVar3 = (local_2748->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (local_2748->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_2740._M_x[0] = (unsigned_long)pPVar6;
      if (pcVar3 == pcVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"What strategy should player ",0x1c);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," use? a) Human b) aggresive c) passive d) random e) cheater",0x3b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::operator>>((istream *)&std::cin,(char *)&local_13b8);
      }
      else {
        if ((ulong)((long)pcVar4 - (long)pcVar3) <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        local_13b8._M_mt._M_x[0]._0_1_ = pcVar3[uVar11] + '\x01';
      }
      strat = (byte)(local_13b8._M_mt._M_x[0]._0_1_ + 0x9e) + AGGRESSIVE_BOT;
      if (3 < (byte)(local_13b8._M_mt._M_x[0]._0_1_ + 0x9e)) {
        strat = HUMAN_PLAYER;
      }
      Player::setPlayerStrategy((Player *)local_2740._M_x[0],strat);
      this_03 = (StatsObserver *)operator_new(0x10);
      StatsObserver::StatsObserver(this_03,(Player *)local_2740._M_x[0]);
      this_04 = (PhaseObserver *)operator_new(0x10);
      PhaseObserver::PhaseObserver(this_04,(Player *)local_2740._M_x[0]);
      __position_00._M_current = *(Player ***)(this_00 + 8);
      if (__position_00._M_current == *(Player ***)(this_00 + 0x10)) {
        std::vector<Player*,std::allocator<Player*>>::_M_realloc_insert<Player*const&>
                  (this_00,__position_00,(Player **)&local_2740);
      }
      else {
        *__position_00._M_current = (Player *)local_2740._M_x[0];
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      uVar11 = uVar11 + 1;
    } while (local_2750 != uVar11);
  }
  __first_00._M_current = *(Player ***)this_00;
  __last_00._M_current = *(Player ***)(this_00 + 8);
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar5 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar5;
  lVar8 = 1;
  uVar11 = local_2740._M_x[0];
  do {
    uVar11 = (ulong)(((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 + (int)lVar8);
    local_2740._M_x[lVar8] = uVar11;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2740._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<Player**,std::vector<Player*,std::allocator<Player*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first_00,__last_00,&local_2740);
  std::random_device::_M_fini();
  if (local_2768.
      super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2768.
                    super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2768.
                          super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2768.
                          super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<Player_*,_std::allocator<Player_*>_> *)this_00;
}

Assistant:

static vector<Player*>* initPlayers(int numPlayers, Map* map, vector<char> playerRoles = {}) {
    vector<vector<Map::Country*>*> countriesPerPlayer;
    countriesPerPlayer.reserve(numPlayers);
    //split up the countries by the number of players
    for (int i = 0; i < numPlayers; i++) {
        auto* countries = new vector<Map::Country*>();
        countries->reserve(map->getMapCountries()->size());
        countriesPerPlayer.emplace_back(countries);
    }
    //randomize map countries
    vector<Map::Country*>* randomizedCountries = map->getMapCountries();
    std::shuffle(randomizedCountries->begin(), randomizedCountries->end(), std::mt19937(std::random_device()()));
    for (unsigned long i = 0; i < randomizedCountries->size(); i++) {
        Map::Country* currCountry = randomizedCountries->at(i);
        currCountry->setPlayerOwnerID(int(i) % numPlayers);
        countriesPerPlayer[i % numPlayers]->push_back(currCountry);
    }

    auto* players = new vector<Player*>();
    players->reserve(numPlayers);
    //create the players with their respective list of countries created above
    for (int i = 0; i < numPlayers; i++) {
        auto* player = new Player(countriesPerPlayer[i], new Hand(), new DiceRoller(), i);

        char strat = 0;

        //support tournament role
        if (playerRoles.empty()) {
            std::cout << "What strategy should player " << i
                      << " use? a) Human b) aggresive c) passive d) random e) cheater" << std::endl;
            std::cin >> strat;
        } else {
            //increment to match with switch case bellow
            strat = playerRoles.at(i);
            strat++;
        }

        switch (strat) {
            case 'a':
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            case 'b':
                player->setPlayerStrategy(Strategies::AGGRESSIVE_BOT);
                break;
            case 'c':
                player->setPlayerStrategy(Strategies::BENEVOLENT_BOT);
                break;
            case 'd':
                player->setPlayerStrategy(Strategies::RANDOM_BOT);
                break;
            case 'e':
                player->setPlayerStrategy(Strategies::CHEATER_BOT);
                break;
            default: {
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            }
        }
        new StatsObserver(player);
        new PhaseObserver(player);
        players->push_back(player);
    }
    std::shuffle(players->begin(), players->end(), std::mt19937(std::random_device()()));
    return players;
}